

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O0

error<idx2::mmap_err_code> idx2::SyncFile(mmap_file *MMap)

{
  int iVar1;
  error<idx2::mmap_err_code> eVar2;
  mmap_file *local_50;
  mmap_err_code local_48;
  undefined2 uStack_44;
  anon_class_1_0_00000001 local_39;
  mmap_file *local_38;
  mmap_err_code local_30;
  undefined2 uStack_2c;
  anon_class_1_0_00000001 local_21;
  mmap_file *local_20;
  mmap_file *MMap_local;
  mmap_err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  local_20 = MMap;
  iVar1 = msync((MMap->Buf).Data,(MMap->Buf).Bytes,4);
  if (iVar1 == -1) {
    eVar2 = SyncFile::anon_class_1_0_00000001::operator()(&local_21);
    local_38 = (mmap_file *)eVar2.Msg;
    MMap_local = local_38;
    local_30 = eVar2.Code;
    local_10 = local_30;
    uStack_2c = eVar2._12_2_;
    uStack_c = uStack_2c;
  }
  else {
    eVar2 = SyncFile::anon_class_1_0_00000001::operator()(&local_39);
    local_50 = (mmap_file *)eVar2.Msg;
    MMap_local = local_50;
    local_48 = eVar2.Code;
    local_10 = local_48;
    uStack_44 = eVar2._12_2_;
    uStack_c = uStack_44;
  }
  eVar2.Code = local_10;
  eVar2.Msg = (cstr)MMap_local;
  eVar2.StackIdx = (undefined1)uStack_c;
  eVar2.StrGened = (bool)uStack_c._1_1_;
  eVar2._14_2_ = uStack_a;
  return eVar2;
}

Assistant:

error<mmap_err_code>
SyncFile(mmap_file* MMap)
{
#if defined(_WIN32)
  if (!FlushFileBuffers(MMap->File))
    return idx2_Error(mmap_err_code::SyncFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  if (msync(MMap->Buf.Data, MMap->Buf.Bytes, MS_SYNC) == -1)
    return idx2_Error(mmap_err_code::SyncFailed);
#endif
  return idx2_Error(mmap_err_code::NoError);
}